

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O2

void __thiscall Parse::SMTLIB2::readAssert(SMTLIB2 *this,LExpr *body)

{
  bool bVar1;
  FormulaUnit *this_00;
  UserErrorException *this_01;
  Formula *fla;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  Inference local_108;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ParseResult res;
  
  this->_nextVar = 0;
  parseTermOrFormula(&res,this,body,false);
  bVar1 = ParseResult::asFormula(&res,&fla);
  if (bVar1) {
    this_00 = (FormulaUnit *)Kernel::FormulaUnit::operator_new(0x48);
    local_128._M_dataplus._M_p._0_1_ = 1;
    Kernel::Inference::Inference(&local_108,(FromInput *)&local_128);
    Kernel::FormulaUnit::FormulaUnit(this_00,fla,&local_108);
    Lib::List<Kernel::Unit_*>::FIFO::pushBack(&this->_formulas,(Unit *)this_00);
    std::__cxx11::string::~string((string *)&res.label);
    return;
  }
  this_01 = (UserErrorException *)__cxa_allocate_exception(0x50);
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_b8,body,true);
  std::operator+(&local_98,"Asserted expression of non-boolean sort ",&local_b8);
  std::operator+(&local_128,&local_98," in top-level expression \'");
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_d8,this->_topLevelExpr,true);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
                 &local_128,&local_d8);
  std::operator+(&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108,
                 "\'");
  Lib::UserErrorException::Exception(this_01,&local_78);
  __cxa_throw(this_01,&Lib::UserErrorException::typeinfo,
              Lib::UserErrorException::~UserErrorException);
}

Assistant:

void SMTLIB2::readAssert(LExpr* body)
{
  _nextVar = 0;
  ASS(_scopes.isEmpty());

  ParseResult res = parseTermOrFormula(body,false/*isSort*/);

  Formula* fla;
  if (!res.asFormula(fla)) {
    USER_ERROR_EXPR("Asserted expression of non-boolean sort "+body->toString());
  }

  FormulaUnit* fu = new FormulaUnit(fla, FromInput(UnitInputType::ASSUMPTION));
  _formulas.pushBack(fu);
}